

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O1

error_code __thiscall basisu::basis_compressor::encode_slices_to_uastc(basis_compressor *this)

{
  vector<basisu::vector<unsigned_char>_> *this_00;
  basisu_backend_slice_desc_vec *this_01;
  gpu_image *pgVar1;
  void *pvVar2;
  basisu_backend_slice_desc *__src;
  job_pool *pjVar3;
  bool bVar4;
  uint16_t uVar5;
  uint32_t total_jobs;
  ulong uVar6;
  undefined8 *puVar7;
  uint uVar8;
  uint uVar9;
  char *__function;
  uint32_t new_size_2;
  uint uVar10;
  job_pool *pJob_pool;
  uint32_t new_size_1;
  uint uVar11;
  long lVar12;
  vector<unsigned_char> *pvVar13;
  ulong uVar14;
  uint32_t new_size;
  atomic<unsigned_int> total_blocks_processed;
  _Any_data local_88;
  undefined4 local_78;
  float fStack_74;
  float fStack_70;
  undefined4 uStack_6c;
  vector<basisu::gpu_image> *local_68;
  uint32_t local_5c;
  uint32_t local_58;
  undefined4 local_54;
  gpu_image *local_50;
  basisu_backend_slice_desc *local_48;
  ulong local_40;
  image *local_38;
  
  debug_printf("basis_compressor::encode_slices_to_uastc\n");
  local_68 = &this->m_uastc_slice_textures;
  uVar10 = (this->m_slice_descs).m_size;
  uVar9 = (this->m_uastc_slice_textures).m_size;
  uVar8 = uVar9 - uVar10;
  if (uVar8 != 0) {
    if (uVar9 < uVar10 || uVar8 == 0) {
      if ((this->m_uastc_slice_textures).m_capacity < uVar10) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_68,uVar10,uVar9 + 1 == uVar10,0x30,
                   vector<basisu::gpu_image>::object_mover,false);
      }
      uVar9 = (this->m_uastc_slice_textures).m_size;
      if (uVar10 - uVar9 != 0) {
        pgVar1 = (this->m_uastc_slice_textures).m_p;
        lVar12 = 0;
        do {
          puVar7 = (undefined8 *)((long)&pgVar1[uVar9].m_blocks.m_p + lVar12);
          *puVar7 = 0;
          puVar7[1] = 0;
          *(undefined4 *)((long)&pgVar1[uVar9].m_fmt + lVar12) = 0xffffffff;
          puVar7 = (undefined8 *)((long)&pgVar1[uVar9].m_width + lVar12);
          *puVar7 = 0;
          puVar7[1] = 0;
          puVar7 = (undefined8 *)((long)&pgVar1[uVar9].m_blocks_y + lVar12);
          *puVar7 = 0;
          puVar7[1] = 0;
          lVar12 = lVar12 + 0x30;
        } while ((ulong)(uVar10 - uVar9) * 0x30 != lVar12);
      }
    }
    else {
      pgVar1 = local_68->m_p;
      lVar12 = 0;
      do {
        pvVar2 = *(void **)((long)&pgVar1[uVar10].m_blocks.m_p + lVar12);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        lVar12 = lVar12 + 0x30;
      } while ((ulong)uVar8 * 0x30 != lVar12);
    }
    (this->m_uastc_slice_textures).m_size = uVar10;
  }
  uVar10 = (this->m_slice_descs).m_size;
  uVar6 = (ulong)uVar10;
  if (uVar10 != 0) {
    lVar12 = 0;
    uVar14 = 0;
    do {
      if ((this->m_uastc_slice_textures).m_size <= uVar14) goto LAB_0021ab8b;
      if (uVar6 <= uVar14) goto LAB_0021ab71;
      gpu_image::init((gpu_image *)((long)&((this->m_uastc_slice_textures).m_p)->m_fmt + lVar12),
                      (EVP_PKEY_CTX *)0x13);
      uVar14 = uVar14 + 1;
      uVar10 = (this->m_slice_descs).m_size;
      uVar6 = (ulong)uVar10;
      lVar12 = lVar12 + 0x30;
    } while (uVar14 < uVar6);
  }
  (this->m_uastc_backend_output).m_tex_format = cUASTC4x4;
  (this->m_uastc_backend_output).m_etc1s = false;
  this_01 = &(this->m_uastc_backend_output).m_slice_desc;
  if ((this->m_uastc_backend_output).m_slice_desc.m_capacity < uVar10) {
    if (this_01->m_p != (basisu_backend_slice_desc *)0x0) {
      free(this_01->m_p);
      this_01->m_p = (basisu_backend_slice_desc *)0x0;
      (this->m_uastc_backend_output).m_slice_desc.m_size = 0;
      (this->m_uastc_backend_output).m_slice_desc.m_capacity = 0;
    }
    elemental_vector::increase_capacity
              ((elemental_vector *)this_01,(this->m_slice_descs).m_size,false,0x30,(object_mover)0x0
               ,false);
  }
  else if ((this->m_uastc_backend_output).m_slice_desc.m_size != 0) {
    (this->m_uastc_backend_output).m_slice_desc.m_size = 0;
  }
  if ((this_01->m_p != (basisu_backend_slice_desc *)0x0) &&
     (__src = (this->m_slice_descs).m_p, __src != (basisu_backend_slice_desc *)0x0)) {
    memcpy(this_01->m_p,__src,(ulong)(this->m_slice_descs).m_size * 0x30);
  }
  uVar10 = (this->m_slice_descs).m_size;
  (this->m_uastc_backend_output).m_slice_desc.m_size = uVar10;
  this_00 = &(this->m_uastc_backend_output).m_slice_image_data;
  uVar9 = (this->m_uastc_backend_output).m_slice_image_data.m_size;
  uVar8 = uVar9 - uVar10;
  if (uVar8 != 0) {
    if (uVar9 < uVar10 || uVar8 == 0) {
      if ((this->m_uastc_backend_output).m_slice_image_data.m_capacity < uVar10) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,uVar10,uVar9 + 1 == uVar10,0x10,(object_mover)0x0,
                   false);
      }
      uVar9 = (this->m_uastc_backend_output).m_slice_image_data.m_size;
      if (uVar10 != uVar9) {
        memset(this_00->m_p + uVar9,0,(ulong)(uVar10 - uVar9) << 4);
      }
    }
    else {
      pvVar13 = this_00->m_p;
      lVar12 = 0;
      do {
        pvVar2 = *(void **)((long)&pvVar13[uVar10].m_p + lVar12);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        lVar12 = lVar12 + 0x10;
      } while ((ulong)uVar8 << 4 != lVar12);
    }
    (this->m_uastc_backend_output).m_slice_image_data.m_size = uVar10;
  }
  uVar10 = (this->m_slice_descs).m_size;
  uVar9 = (this->m_uastc_backend_output).m_slice_image_crcs.m_size;
  if (uVar9 != uVar10) {
    if (uVar9 <= uVar10) {
      if ((this->m_uastc_backend_output).m_slice_image_crcs.m_capacity < uVar10) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&(this->m_uastc_backend_output).m_slice_image_crcs,uVar10,
                   uVar9 + 1 == uVar10,2,(object_mover)0x0,false);
      }
      uVar9 = (this->m_uastc_backend_output).m_slice_image_crcs.m_size;
      memset((this->m_uastc_backend_output).m_slice_image_crcs.m_p + uVar9,0,
             (ulong)(uVar10 - uVar9) * 2);
    }
    (this->m_uastc_backend_output).m_slice_image_crcs.m_size = uVar10;
  }
  uVar10 = (this->m_slice_descs).m_size;
  if (uVar10 != 0) {
    uVar9 = 0;
    do {
      if ((this->m_uastc_slice_textures).m_size <= uVar9) goto LAB_0021ab8b;
      uVar6 = (ulong)uVar9;
      if (uVar10 <= uVar9) goto LAB_0021ab71;
      if ((this->m_slice_images).m_size <= uVar9) {
        __function = "T &basisu::vector<basisu::image>::operator[](size_t) [T = basisu::image]";
        goto LAB_0021ac2d;
      }
      local_50 = local_68->m_p + uVar6;
      local_48 = (this->m_slice_descs).m_p + uVar6;
      local_58 = local_50->m_blocks_x;
      local_5c = local_50->m_blocks_y;
      uVar10 = local_5c * local_58;
      local_38 = (this->m_slice_images).m_p + uVar6;
      LOCK();
      local_54 = 0;
      UNLOCK();
      local_40 = uVar6;
      if (uVar10 != 0) {
        uVar9 = 0;
        do {
          uVar11 = uVar9 + 0x100;
          uVar8 = uVar11;
          if (uVar10 < uVar11) {
            uVar8 = uVar10;
          }
          pjVar3 = (this->m_params).m_pJob_pool;
          local_78 = 0;
          fStack_74 = 0.0;
          fStack_70 = 0.0;
          uStack_6c = 0;
          local_88._0_4_ = 0;
          local_88._4_4_ = 0;
          local_88._8_4_ = 0.0;
          local_88._12_4_ = 0.0;
          puVar7 = (undefined8 *)operator_new(0x38);
          *puVar7 = this;
          *(uint *)(puVar7 + 1) = uVar9;
          *(uint *)((long)puVar7 + 0xc) = uVar8;
          *(uint32_t *)(puVar7 + 2) = local_58;
          *(uint32_t *)((long)puVar7 + 0x14) = local_5c;
          *(uint *)(puVar7 + 3) = uVar10;
          puVar7[4] = local_38;
          puVar7[5] = local_50;
          puVar7[6] = &local_54;
          local_88._0_4_ = SUB84(puVar7,0);
          local_88._4_4_ = (undefined4)((ulong)puVar7 >> 0x20);
          fStack_70 = 3.131995e-39;
          uStack_6c = 0;
          local_78 = 0x221c28;
          fStack_74 = 0.0;
          job_pool::add_job(pjVar3,(function<void_()> *)&local_88);
          if ((code *)CONCAT44(fStack_74,local_78) != (code *)0x0) {
            (*(code *)CONCAT44(fStack_74,local_78))(&local_88,&local_88,3);
          }
          uVar9 = uVar11;
        } while (uVar11 < uVar10);
      }
      job_pool::wait_for_all((this->m_params).m_pJob_pool);
      uVar6 = local_40;
      pgVar1 = local_50;
      if ((this->m_params).m_rdo_uastc.m_value != false) {
        local_78 = CONCAT31(local_78._1_3_,1);
        uStack_6c = 100;
        local_88._4_4_ = (this->m_params).m_rdo_uastc_quality_scalar.m_value;
        local_88._8_4_ = (this->m_params).m_rdo_uastc_max_allowed_rms_increase_ratio.m_value;
        local_88._12_4_ = (this->m_params).m_rdo_uastc_skip_block_rms_thresh.m_value;
        local_88._0_4_ = (this->m_params).m_rdo_uastc_dict_size.m_value;
        fStack_70 = (this->m_params).m_rdo_uastc_max_smooth_block_error_scale.m_value;
        fStack_74 = (this->m_params).m_rdo_uastc_smooth_block_max_std_dev.m_value;
        if ((local_50->m_blocks).m_size == 0) {
LAB_0021aba5:
          __function = "T &basisu::vector<unsigned long>::operator[](size_t) [T = unsigned long]";
        }
        else {
          if (local_48->m_first_block_index < (this->m_source_blocks).m_size) {
            bVar4 = (this->m_params).m_rdo_uastc_multithreading.m_value;
            pjVar3 = (this->m_params).m_pJob_pool;
            total_jobs = 0;
            pJob_pool = (job_pool *)0x0;
            if (bVar4 != false) {
              pJob_pool = pjVar3;
            }
            if (((pjVar3 != (job_pool *)0x0 & bVar4) == 1) &&
               (total_jobs = (int)((ulong)((long)(pjVar3->m_threads).
                                                 super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pjVar3->m_threads).
                                                super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1
               , 3 < total_jobs)) {
              total_jobs = 4;
            }
            bVar4 = uastc_rdo(local_50->m_blocks_y * local_50->m_blocks_x,
                              (uastc_block *)(local_50->m_blocks).m_p,
                              (color_rgba *)
                              ((this->m_source_blocks).m_p + local_48->m_first_block_index),
                              (uastc_rdo_params *)&local_88,(this->m_params).m_pack_uastc_flags,
                              pJob_pool,total_jobs);
            if (!bVar4) {
              return cECFailedUASTCRDOPostProcess;
            }
            goto LAB_0021aa39;
          }
          __function = 
          "T &basisu::vector<basisu::pixel_block>::operator[](size_t) [T = basisu::pixel_block]";
        }
        goto LAB_0021ac2d;
      }
LAB_0021aa39:
      uVar9 = (uint)uVar6;
      if ((this->m_uastc_backend_output).m_slice_image_data.m_size <= uVar9) {
LAB_0021abbc:
        __function = 
        "T &basisu::vector<basisu::vector<unsigned char>>::operator[](size_t) [T = basisu::vector<unsigned char>]"
        ;
        goto LAB_0021ac2d;
      }
      uVar8 = pgVar1->m_blocks_x * pgVar1->m_blocks_y * pgVar1->m_qwords_per_block * 8;
      uVar10 = this_00->m_p[uVar6].m_size;
      pvVar13 = this_00->m_p + uVar6;
      if (uVar10 != uVar8) {
        if (uVar10 <= uVar8) {
          if (pvVar13->m_capacity < uVar8) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)pvVar13,uVar8,uVar10 + 1 == uVar8,1,(object_mover)0x0,
                       false);
          }
          memset(pvVar13->m_p + pvVar13->m_size,0,(ulong)(uVar8 - pvVar13->m_size));
        }
        pvVar13->m_size = uVar8;
      }
      if ((this->m_uastc_backend_output).m_slice_image_data.m_size <= uVar9) goto LAB_0021abbc;
      if (this_00->m_p[uVar6].m_size == 0) {
        __function = "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]";
        goto LAB_0021ac2d;
      }
      if (((pgVar1->m_blocks).m_size == 0) ||
         (memcpy(this_00->m_p[uVar6].m_p,(pgVar1->m_blocks).m_p,
                 (ulong)(pgVar1->m_blocks_x * pgVar1->m_blocks_y * pgVar1->m_qwords_per_block * 8)),
         (pgVar1->m_blocks).m_size == 0)) goto LAB_0021aba5;
      uVar5 = basist::crc16((pgVar1->m_blocks).m_p,
                            (ulong)(pgVar1->m_blocks_x * pgVar1->m_blocks_y *
                                    pgVar1->m_qwords_per_block * 8),0);
      if ((this->m_uastc_backend_output).m_slice_image_crcs.m_size <= uVar9) {
        __function = "T &basisu::vector<unsigned short>::operator[](size_t) [T = unsigned short]";
        goto LAB_0021ac2d;
      }
      (this->m_uastc_backend_output).m_slice_image_crcs.m_p[uVar6] = uVar5;
      uVar9 = uVar9 + 1;
      uVar10 = (this->m_slice_descs).m_size;
    } while (uVar9 < uVar10);
  }
  return cECSuccess;
LAB_0021ab8b:
  __function = "T &basisu::vector<basisu::gpu_image>::operator[](size_t) [T = basisu::gpu_image]";
  goto LAB_0021ac2d;
LAB_0021ab71:
  __function = 
  "T &basisu::vector<basisu::basisu_backend_slice_desc>::operator[](size_t) [T = basisu::basisu_backend_slice_desc]"
  ;
LAB_0021ac2d:
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x178,__function);
}

Assistant:

basis_compressor::error_code basis_compressor::encode_slices_to_uastc()
	{
		debug_printf("basis_compressor::encode_slices_to_uastc\n");

		m_uastc_slice_textures.resize(m_slice_descs.size());
		for (uint32_t slice_index = 0; slice_index < m_slice_descs.size(); slice_index++)
			m_uastc_slice_textures[slice_index].init(texture_format::cUASTC4x4, m_slice_descs[slice_index].m_orig_width, m_slice_descs[slice_index].m_orig_height);

		m_uastc_backend_output.m_tex_format = basist::basis_tex_format::cUASTC4x4;
		m_uastc_backend_output.m_etc1s = false;
		m_uastc_backend_output.m_slice_desc = m_slice_descs;
		m_uastc_backend_output.m_slice_image_data.resize(m_slice_descs.size());
		m_uastc_backend_output.m_slice_image_crcs.resize(m_slice_descs.size());
				
		for (uint32_t slice_index = 0; slice_index < m_slice_descs.size(); slice_index++)
		{
			gpu_image& tex = m_uastc_slice_textures[slice_index];
			basisu_backend_slice_desc& slice_desc = m_slice_descs[slice_index];
			(void)slice_desc;

			const uint32_t num_blocks_x = tex.get_blocks_x();
			const uint32_t num_blocks_y = tex.get_blocks_y();
			const uint32_t total_blocks = tex.get_total_blocks();
			const image& source_image = m_slice_images[slice_index];
			
			std::atomic<uint32_t> total_blocks_processed;
			total_blocks_processed = 0;

			const uint32_t N = 256;
			for (uint32_t block_index_iter = 0; block_index_iter < total_blocks; block_index_iter += N)
			{
				const uint32_t first_index = block_index_iter;
				const uint32_t last_index = minimum<uint32_t>(total_blocks, block_index_iter + N);

				// FIXME: This sucks, but we're having a stack size related problem with std::function with emscripten.
#ifndef __EMSCRIPTEN__
				m_params.m_pJob_pool->add_job([this, first_index, last_index, num_blocks_x, num_blocks_y, total_blocks, &source_image, &tex, &total_blocks_processed]
					{
#endif
						BASISU_NOTE_UNUSED(num_blocks_y);
						
						uint32_t uastc_flags = m_params.m_pack_uastc_flags;
						if ((m_params.m_rdo_uastc) && (m_params.m_rdo_uastc_favor_simpler_modes_in_rdo_mode))
							uastc_flags |= cPackUASTCFavorSimplerModes;

						for (uint32_t block_index = first_index; block_index < last_index; block_index++)
						{
							const uint32_t block_x = block_index % num_blocks_x;
							const uint32_t block_y = block_index / num_blocks_x;

							color_rgba block_pixels[4][4];

							source_image.extract_block_clamped((color_rgba*)block_pixels, block_x * 4, block_y * 4, 4, 4);

							basist::uastc_block& dest_block = *(basist::uastc_block*)tex.get_block_ptr(block_x, block_y);

							encode_uastc(&block_pixels[0][0].r, dest_block, uastc_flags);

							total_blocks_processed++;
							
							uint32_t val = total_blocks_processed;
							if ((val & 16383) == 16383)
							{
								debug_printf("basis_compressor::encode_slices_to_uastc: %3.1f%% done\n", static_cast<float>(val) * 100.0f / total_blocks);
							}

						}

#ifndef __EMSCRIPTEN__
					});
#endif

			} // block_index_iter

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->wait_for_all();
#endif

			if (m_params.m_rdo_uastc)
			{
				uastc_rdo_params rdo_params;
				rdo_params.m_lambda = m_params.m_rdo_uastc_quality_scalar;
				rdo_params.m_max_allowed_rms_increase_ratio = m_params.m_rdo_uastc_max_allowed_rms_increase_ratio;
				rdo_params.m_skip_block_rms_thresh = m_params.m_rdo_uastc_skip_block_rms_thresh;
				rdo_params.m_lz_dict_size = m_params.m_rdo_uastc_dict_size;
				rdo_params.m_smooth_block_max_error_scale = m_params.m_rdo_uastc_max_smooth_block_error_scale;
				rdo_params.m_max_smooth_block_std_dev = m_params.m_rdo_uastc_smooth_block_max_std_dev;
								
				bool status = uastc_rdo(tex.get_total_blocks(), (basist::uastc_block*)tex.get_ptr(),
					(const color_rgba *)m_source_blocks[slice_desc.m_first_block_index].m_pixels, rdo_params, m_params.m_pack_uastc_flags, m_params.m_rdo_uastc_multithreading ? m_params.m_pJob_pool : nullptr,
					(m_params.m_rdo_uastc_multithreading && m_params.m_pJob_pool) ? basisu::minimum<uint32_t>(4, (uint32_t)m_params.m_pJob_pool->get_total_threads()) : 0);
				if (!status)
				{
					return cECFailedUASTCRDOPostProcess;
				}
			}

			m_uastc_backend_output.m_slice_image_data[slice_index].resize(tex.get_size_in_bytes());
			memcpy(&m_uastc_backend_output.m_slice_image_data[slice_index][0], tex.get_ptr(), tex.get_size_in_bytes());
			
			m_uastc_backend_output.m_slice_image_crcs[slice_index] = basist::crc16(tex.get_ptr(), tex.get_size_in_bytes(), 0);
						
		} // slice_index
				
		return cECSuccess;
	}